

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool Fossilize::Hashing::validate_pnext_chain(void *pNext,VkStructureType *expected,uint32_t count)

{
  VkStructureType *pVVar1;
  VkStructureType local_34;
  VkStructureType *pVStack_30;
  VkStructureType sType;
  VkBaseInStructure *pin;
  VkStructureType *pVStack_20;
  uint32_t count_local;
  VkStructureType *expected_local;
  void *pNext_local;
  
  pin._4_4_ = count;
  pVStack_20 = expected;
  expected_local = (VkStructureType *)pNext;
  while( true ) {
    pVStack_30 = (VkStructureType *)pnext_chain_skip_ignored_entries(expected_local);
    if (pVStack_30 == (VkStructureType *)0x0) {
      return true;
    }
    local_34 = *pVStack_30;
    expected_local = pVStack_30;
    pVVar1 = std::find<VkStructureType_const*,VkStructureType>
                       (pVStack_20,pVStack_20 + pin._4_4_,&local_34);
    if (pVVar1 == pVStack_20 + pin._4_4_) break;
    expected_local = *(VkStructureType **)(pVStack_30 + 2);
  }
  return false;
}

Assistant:

static bool validate_pnext_chain(const void *pNext, const VkStructureType *expected, uint32_t count)
{
	while ((pNext = pnext_chain_skip_ignored_entries(pNext)) != nullptr)
	{
		auto *pin = static_cast<const VkBaseInStructure *>(pNext);
		auto sType = pin->sType;
		if (std::find(expected, expected + count, sType) == expected + count)
			return false;
		pNext = pin->pNext;
	}

	return true;
}